

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmLibrary.cpp
# Opt level: O3

JavascriptMethod Js::WasmLibrary::EnsureWasmEntrypoint(ScriptFunction *func)

{
  ScriptContext *scriptContext;
  WasmReaderInfo *readerinfo;
  bool bVar1;
  uint32 uVar2;
  FunctionBody *pFVar3;
  void *pvVar4;
  ProxyEntryPointInfo *pPVar5;
  code *pcVar6;
  undefined4 *puVar7;
  JavascriptMethod p_Var8;
  AutoFreeExceptionMessage autoCleanExceptionMessage;
  
  pFVar3 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  if (((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) == 0) {
    return (JavascriptMethod)0x0;
  }
  pFVar3 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  pvVar4 = FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar3,AsmJsFunctionInfo);
  scriptContext =
       (((((func->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  pPVar5 = ScriptFunction::GetEntryPointInfo(func);
  if (*(long *)((long)pvVar4 + 0xb0) == 0) {
    uVar2 = FunctionBody::GetCountField(pFVar3,ByteCodeCount);
    if (uVar2 == 0) {
      readerinfo = *(WasmReaderInfo **)((long)pvVar4 + 0x90);
      if (readerinfo == (WasmReaderInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WasmLibrary.cpp"
                                    ,0x37,"(readerInfo)","readerInfo");
        if (!bVar1) goto LAB_00d85f76;
        *puVar7 = 0;
      }
      Wasm::WasmBytecodeGenerator::GenerateFunctionBytecode(scriptContext,readerinfo,false);
      pPVar5->jsMethod = InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
      WAsmJs::JitFunctionIfReady(func,0);
    }
    else {
      if (-1 < *(int *)&pFVar3->field_0x178) {
        pcVar6 = InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
        goto LAB_00d85e0c;
      }
      pPVar5 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)pFVar3);
      ScriptFunction::ChangeEntryPoint(func,pPVar5,(JavascriptMethod)pPVar5->jsMethod);
    }
  }
  else {
    pcVar6 = WasmLazyTrapCallback;
LAB_00d85e0c:
    pPVar5->jsMethod = pcVar6;
  }
  bVar1 = FunctionProxy::HasValidEntryPoint((FunctionProxy *)pFVar3);
  if (!bVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WasmLibrary.cpp"
                                ,0x56,"(body->HasValidEntryPoint())","body->HasValidEntryPoint()");
    if (!bVar1) {
LAB_00d85f76:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar7 = 0;
  }
  pPVar5 = ScriptFunction::GetEntryPointInfo(func);
  p_Var8 = (JavascriptMethod)0x0;
  if (pPVar5->jsMethod != InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk) {
    p_Var8 = (JavascriptMethod)pPVar5->jsMethod;
  }
  return p_Var8;
}

Assistant:

Js::JavascriptMethod Js::WasmLibrary::EnsureWasmEntrypoint(Js::ScriptFunction* func)
{
#ifdef ENABLE_WASM
    if (func->GetFunctionBody()->IsWasmFunction())
    {
        FunctionBody* body = func->GetFunctionBody();
        AsmJsFunctionInfo* info = body->GetAsmJsFunctionInfo();
        ScriptContext* scriptContext = func->GetScriptContext();

        Js::FunctionEntryPointInfo * entrypointInfo = (Js::FunctionEntryPointInfo*)func->GetEntryPointInfo();
        if (info->GetLazyError())
        {
            // We might have parsed this in the past and there was an error
            entrypointInfo->jsMethod = WasmLibrary::WasmLazyTrapCallback;
        }
        else if (body->GetByteCodeCount() == 0)
        {
            Wasm::WasmReaderInfo* readerInfo = info->GetWasmReaderInfo();
            AssertOrFailFast(readerInfo);
            try
            {
                Wasm::WasmBytecodeGenerator::GenerateFunctionBytecode(scriptContext, readerInfo);
                entrypointInfo->jsMethod = AsmJsDefaultEntryThunk;
                WAsmJs::JitFunctionIfReady(func);
            }
            catch (Wasm::WasmCompilationException& ex)
            {
                AutoFreeExceptionMessage autoCleanExceptionMessage;
                char16* exceptionMessage = WebAssemblyModule::FormatExceptionMessage(&ex, &autoCleanExceptionMessage, readerInfo->m_module, body);

                JavascriptLibrary *library = scriptContext->GetLibrary();
                JavascriptError *pError = library->CreateWebAssemblyCompileError();
                JavascriptError::SetErrorMessage(pError, WASMERR_WasmCompileError, exceptionMessage, scriptContext);

                entrypointInfo->jsMethod = WasmLibrary::WasmLazyTrapCallback;
                info->SetLazyError(pError);
            }
        }
        // The function has already been parsed, just fix up the entry point
        else if (body->GetIsAsmJsFullJitScheduled())
        {
            Js::FunctionEntryPointInfo* defaultEntryPoint = (Js::FunctionEntryPointInfo*)body->GetDefaultEntryPointInfo();
            func->ChangeEntryPoint(defaultEntryPoint, defaultEntryPoint->jsMethod);
        }
        else
        {
            entrypointInfo->jsMethod = AsmJsDefaultEntryThunk;
        }

        Assert(body->HasValidEntryPoint());
        Js::JavascriptMethod jsMethod = func->GetEntryPointInfo()->jsMethod;
        // We are already in AsmJsDefaultEntryThunk so return null so it just keeps going
        return jsMethod == AsmJsDefaultEntryThunk ? nullptr : jsMethod;
    }
#endif
    return nullptr;
}